

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEException.cpp
# Opt level: O3

bool __thiscall test_CEException::test_sofa_error(test_CEException *this)

{
  sofa_error *this_00;
  allocator local_8f;
  allocator local_8e;
  allocator local_8d;
  int local_8c;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = (sofa_error *)__cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"test_CEException::test_sofa_error()",&local_8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"No method currently checked",&local_8d);
  local_8c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"Testing throwing \'CEException::sofa_error",&local_8e);
  CEException::sofa_error::sofa_error(this_00,&local_88,&local_68,&local_8c,&local_48);
  __cxa_throw(this_00,&CEException::sofa_error::typeinfo,CEExceptionHandler::~CEExceptionHandler);
}

Assistant:

bool test_CEException::test_sofa_error(void)
{
    // Try throwing
    try {
        // TODO: find a sofa method that can be configured to return a bad error code
        throw CEException::sofa_error("test_CEException::test_sofa_error()",
                                      "No method currently checked",
                                      1, "Testing throwing 'CEException::sofa_error");
        // If we get here there's a problem
        log_failure("CEException::sofa_error failed to throw", __func__, __LINE__);
        update_pass(false);
    } catch (CEException::sofa_error & e) {
        // This is where we should be
        log_success("CEException::sofa_error thrown successfully", __func__, __LINE__);
        update_pass(true);
    }

    return pass();
}